

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ParsePrimMetas(AsciiParser *this,PrimMetaMap *args)

{
  StreamReader *pSVar1;
  bool bVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> m;
  ostringstream ss_e;
  uint8_t local_211;
  string local_210;
  char local_1f0;
  pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> local_1e8;
  undefined1 local_1a8 [8];
  pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> local_1a0;
  ios_base local_138 [264];
  
  bVar2 = Expect(this,'(');
  if ((bVar2) && (bVar2 = SkipCommentAndWhitespaceAndNewline(this,true), bVar2)) {
    do {
      pSVar1 = this->_sr;
      if (pSVar1->length_ <= pSVar1->idx_) {
        return true;
      }
      if (pSVar1->binary_[pSVar1->idx_] == '\0') {
        return true;
      }
      bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar2) {
        return false;
      }
      pSVar1 = this->_sr;
      uVar5 = pSVar1->idx_ + 1;
      if (uVar5 <= pSVar1->length_) {
        local_211 = pSVar1->binary_[pSVar1->idx_];
        pSVar1->idx_ = uVar5;
      }
      iVar8 = 1;
      if ((uVar5 <= pSVar1->length_) && (iVar8 = 3, local_211 != ')')) {
        uVar5 = pSVar1->idx_ - 1;
        if ((-1 < (long)uVar5) && (uVar5 <= pSVar1->length_)) {
          pSVar1->idx_ = uVar5;
        }
        ParsePrimMeta((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)
                      local_1a8,this);
        local_1f0 = local_1a8[0];
        if (local_1a8[0] == true) {
          ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::pair
                    (&local_1e8,
                     (pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable> *)(local_1a8 + 8));
        }
        if (local_1a8[0] == true) {
          nonstd::optional_lite::detail::
          storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::destruct_value
                    ((storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)
                     (local_1a8 + 8));
        }
        if (local_1f0 == '\x01') {
          if (local_1e8.second._name._M_string_length == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParsePrimMetas",0xe);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)
                     ::std::ostream::operator<<
                               ((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
                                 *)local_1a8,0xc85);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            lVar6 = 0x29;
            pcVar7 = "[InternalError] Metadataum name is empty.";
            goto LAB_003ed7dd;
          }
          pmVar3 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                   ::operator[](args,(key_type *)&local_1e8.second._name);
          pmVar3->first = local_1e8.first;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar3->second)._name);
          linb::any::operator=((any *)&pmVar3->second,(any *)&local_1e8.second);
          iVar8 = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParsePrimMetas",0xe);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)
                   ::std::ostream::operator<<
                             ((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
                               *)local_1a8,0xc8a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          lVar6 = 0x1b;
          pcVar7 = "Failed to parse Meta value.";
LAB_003ed7dd:
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar6);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          iVar8 = 1;
        }
        if (local_1f0 == '\x01') {
          nonstd::optional_lite::detail::
          storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::destruct_value
                    ((storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)
                     &local_1e8);
        }
      }
    } while (iVar8 == 0);
    if (iVar8 == 3) {
      return true;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParsePrimMetas(PrimMetaMap *args) {
  // '(' args ')'
  // args = list of argument, separated by newline.

  if (!Expect('(')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    // std::cout << "skip comment/whitespace/nl failed\n";
    DCOUT("SkipCommentAndWhitespaceAndNewline failed.");
    return false;
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      // std::cout << "2: skip comment/whitespace/nl failed\n";
      return false;
    }

    char s;
    if (!Char1(&s)) {
      return false;
    }

    if (s == ')') {
      DCOUT("Prim meta end");
      // End
      break;
    }

    Rewind(1);

    DCOUT("Start PrimMeta parse.");

    // ty = std::pair<ListEditQual, MetaVariable>;
    if (auto m = ParsePrimMeta()) {
      DCOUT("PrimMeta: list-edit qual = "
            << tinyusdz::to_string(std::get<0>(m.value()))
            << ", name = " << std::get<1>(m.value()).get_name());

      if (std::get<1>(m.value()).get_name().empty()) {
        PUSH_ERROR_AND_RETURN("[InternalError] Metadataum name is empty.");
      }

      (*args)[std::get<1>(m.value()).get_name()] = m.value();
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse Meta value.");
    }
  }

  return true;
}